

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

Array<capnp::compiler::BrandedDecl> *
kj::heapArray<capnp::compiler::BrandedDecl>
          (Array<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandedDecl *content,
          size_t size)

{
  BrandedDecl *pos;
  BrandedDecl *pBVar1;
  Array<capnp::compiler::BrandedDecl> *result;
  
  pos = (BrandedDecl *)
        _::HeapArrayDisposer::allocateImpl
                  (0xa8,0,size,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pBVar1 = _::
           CopyConstructArray_<capnp::compiler::BrandedDecl,_capnp::compiler::BrandedDecl_*,_false,_false>
           ::apply(pos,content,content + size);
  __return_storage_ptr__->ptr = pos;
  __return_storage_ptr__->size_ = ((long)pBVar1 - (long)pos >> 3) * -0x30c30c30c30c30c3;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

Array<T> heapArray(T* content, size_t size) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(size);
  builder.addAll(content, content + size);
  return builder.finish();
}